

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarimaxtest3.c
# Opt level: O0

int main(void)

{
  int iVar1;
  double *xpred_00;
  double *amse_00;
  FILE *__stream;
  double *inp_00;
  double *xreg_00;
  double *newxreg_00;
  sarimax_object obj_00;
  double local_7108;
  double temp2 [1200];
  double temp1 [1200];
  double temp [1200];
  FILE *ifp;
  int imean;
  sarimax_object obj;
  double *newxreg;
  double *xreg;
  double *amse;
  double *xpred;
  int r;
  int s;
  int Q;
  int P;
  int q;
  int p;
  double *inp;
  int L;
  int D;
  int d;
  int N;
  int i;
  
  xpred_00 = (double *)malloc(0x28);
  amse_00 = (double *)malloc(0x28);
  __stream = fopen("../data/e1m.dat","r");
  d = 0;
  if (__stream != (FILE *)0x0) {
    while (iVar1 = feof(__stream), iVar1 == 0) {
      __isoc99_fscanf(__stream,"%lf %lf %lf \n",temp1 + (long)d + 0x4af,temp2 + (long)d + 0x4af,
                      temp2 + (long)d + -1);
      d = d + 1;
    }
    iVar1 = d + -5;
    inp_00 = (double *)malloc((long)iVar1 << 3);
    xreg_00 = (double *)malloc((long)iVar1 << 4);
    newxreg_00 = (double *)malloc(0x50);
    for (d = 0; d < iVar1; d = d + 1) {
      inp_00[d] = temp1[(long)d + 0x4af];
      xreg_00[d] = temp2[(long)d + 0x4af];
      xreg_00[iVar1 + d] = temp2[(long)d + -1];
    }
    for (d = 0; d < 5; d = d + 1) {
      newxreg_00[d] = temp2[(long)(iVar1 + d) + 0x4af];
      newxreg_00[d + 5] = temp2[(long)(iVar1 + d) + -1];
    }
    obj_00 = sarimax_init(2,0,2,0,0,0,0,2,1,iVar1);
    sarimax_setMethod(obj_00,2);
    sarimax_exec(obj_00,inp_00,xreg_00);
    sarimax_summary(obj_00);
    sarimax_predict(obj_00,inp_00,xreg_00,5,newxreg_00,xpred_00,amse_00);
    printf("\n");
    printf("Predicted Values : ");
    for (d = 0; d < 5; d = d + 1) {
      printf("%g ",xpred_00[d]);
    }
    printf("\n");
    printf("Standard Errors  : ");
    for (d = 0; d < 5; d = d + 1) {
      sqrt(amse_00[d]);
      printf("%g ");
    }
    printf("\n");
    sarimax_free(obj_00);
    free(inp_00);
    free(xpred_00);
    free(amse_00);
    free(xreg_00);
    free(newxreg_00);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main(void) {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *xpred, *amse,*xreg,*newxreg;
	sarimax_object obj;
	int imean = 1;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 2;
	d = 0;
	q = 2;
	s = 0;
	P = 0;
	D = 0;
	Q = 0;
	r = 2;


	L = 5;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/e1m.dat", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf %lf %lf \n", &temp[i],&temp1[i],&temp2[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        xreg[i] = temp1[i];
		xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        newxreg[i] = temp1[N + i];
        newxreg[i+L] = temp2[N + i];
    }

	obj = sarimax_init(p, d, q, P, D, Q, s, r ,imean, N);

    /* setMethod()
    Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
    */

	sarimax_setMethod(obj, 2); 

    /*sarimax_exec(object, input time series, exogenous time series)
        set exogenous to NULL if deadling only with a univariate time series.
    */
	sarimax_exec(obj, inp,xreg);
	sarimax_summary(obj);
	/* sarimax_predict(sarimax_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse)
        inp - Input Time Series
        xreg - Exogenous Time Series
        L - L point prediction
        newxreg - Exogenous Time Series of dimension r * L where r is the number of exogenus time series and L is the length of each
        xpred - L future values
        amse - MSE for L future values
    */
	sarimax_predict(obj, inp, xreg, L, newxreg, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");

	sarimax_free(obj);
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);
	return 0;

}